

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

string * __thiscall
(anonymous_namespace)::Helper::GetDocDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  long *plVar1;
  size_type *psVar2;
  cmInstallCommandArguments *args_00;
  string local_80;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_INSTALL_DOCDIR","");
  GetDataRootDestination_abi_cxx11_(&local_40,this,args_00);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  anon_unknown.dwarf_644e4c::Helper::GetDestination
            (__return_storage_ptr__,(Helper *)this,(cmInstallCommandArguments *)0x0,&local_60,
             &local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetDocDestination(
  const cmInstallCommandArguments* args) const
{
  return this->GetDestination(args, "CMAKE_INSTALL_DOCDIR",
                              this->GetDataRootDestination(nullptr) + "/doc");
}